

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiImageClearingTests.cpp
# Opt level: O2

VkClearValue
vkt::api::anon_unknown_0::makeClearColorValue(VkFormat format,float r,float g,float b,float a)

{
  VkClearValue VVar1;
  TextureChannelClass TVar2;
  ChannelType channelType;
  float fVar3;
  undefined4 in_XMM0_Db;
  float fVar5;
  undefined4 in_XMM0_Dc;
  float fVar6;
  undefined4 in_XMM0_Dd;
  float fVar7;
  undefined1 auVar4 [16];
  undefined1 auVar8 [16];
  VkClearValue VVar9;
  undefined1 auVar10 [16];
  TextureFormat tcuFormat;
  UVec4 maxValues;
  TextureFormat local_60;
  float local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  float local_48;
  float local_38;
  float local_28;
  uint local_18;
  uint uStack_14;
  uint uStack_10;
  uint uStack_c;
  
  local_58 = r;
  uStack_54 = in_XMM0_Db;
  uStack_50 = in_XMM0_Dc;
  uStack_4c = in_XMM0_Dd;
  local_48 = a;
  local_38 = g;
  local_28 = b;
  local_60 = ::vk::mapVkFormat(format);
  channelType = local_60.type;
  TVar2 = tcu::getTextureChannelClass(channelType);
  if (((TVar2 != TEXTURECHANNELCLASS_FLOATING_POINT) &&
      (TVar2 = tcu::getTextureChannelClass(channelType),
      TVar2 != TEXTURECHANNELCLASS_SIGNED_FIXED_POINT)) &&
     (TVar2 = tcu::getTextureChannelClass(channelType),
     TVar2 != TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT)) {
    TVar2 = tcu::getTextureChannelClass(channelType);
    if (TVar2 == TEXTURECHANNELCLASS_UNSIGNED_INTEGER) {
      tcu::getFormatMaxUintValue((tcu *)&local_18,&local_60);
      fVar3 = ((float)(local_18 >> 0x10 | 0x53000000) - 5.497642e+11) +
              (float)(local_18 & 0xffff | 0x4b000000);
      fVar5 = ((float)(uStack_14 >> 0x10 | 0x53000000) - 5.497642e+11) +
              (float)(uStack_14 & 0xffff | 0x4b000000);
      fVar6 = ((float)(uStack_10 >> 0x10 | 0x53000000) - 5.497642e+11) +
              (float)(uStack_10 & 0xffff | 0x4b000000);
      fVar7 = ((float)(uStack_c >> 0x10 | 0x53000000) - 5.497642e+11) +
              (float)(uStack_c & 0xffff | 0x4b000000);
    }
    else {
      TVar2 = tcu::getTextureChannelClass(channelType);
      VVar1.depthStencil.stencil = uStack_54;
      VVar1.depthStencil.depth = local_58;
      VVar1._8_4_ = uStack_50;
      VVar1._12_4_ = uStack_4c;
      if (TVar2 != TEXTURECHANNELCLASS_SIGNED_INTEGER) {
        return VVar1;
      }
      tcu::getFormatMaxIntValue((tcu *)&local_18,&local_60);
      fVar3 = (float)(int)local_18;
      fVar5 = (float)(int)uStack_14;
      fVar6 = (float)(int)uStack_10;
      fVar7 = (float)(int)uStack_c;
    }
    auVar4._0_4_ = (int)(local_58 * fVar3);
    auVar4._4_4_ = (int)(local_38 * fVar5);
    auVar4._8_4_ = (int)(local_28 * fVar6);
    auVar4._12_4_ = (int)(local_48 * fVar7);
    auVar8._0_4_ = auVar4._0_4_ >> 0x1f;
    auVar8._4_4_ = auVar4._4_4_ >> 0x1f;
    auVar8._8_4_ = auVar4._8_4_ >> 0x1f;
    auVar8._12_4_ = auVar4._12_4_ >> 0x1f;
    auVar10._0_4_ = (int)(local_58 * fVar3 - 2.1474836e+09);
    auVar10._4_4_ = (int)(local_38 * fVar5 - 2.1474836e+09);
    auVar10._8_4_ = (int)(local_28 * fVar6 - 2.1474836e+09);
    auVar10._12_4_ = (int)(local_48 * fVar7 - 2.1474836e+09);
    return (VkClearValue)(auVar10 & auVar8 | auVar4);
  }
  VVar9._12_4_ = local_48;
  VVar9._8_4_ = local_28;
  VVar9.depthStencil.stencil = (deUint32)local_38;
  VVar9.depthStencil.depth = local_58;
  return VVar9;
}

Assistant:

VkClearValue makeClearColorValue (VkFormat format, float r, float g, float b, float a)
{
	const	TextureFormat tcuFormat	= mapVkFormat(format);
	VkClearValue clearValue;

	if (getTextureChannelClass(tcuFormat.type) == TEXTURECHANNELCLASS_FLOATING_POINT
		|| getTextureChannelClass(tcuFormat.type) == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT
		|| getTextureChannelClass(tcuFormat.type) == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT)
	{
		clearValue.color.float32[0] = r;
		clearValue.color.float32[1] = g;
		clearValue.color.float32[2] = b;
		clearValue.color.float32[3] = a;
	}
	else if (getTextureChannelClass(tcuFormat.type) == TEXTURECHANNELCLASS_UNSIGNED_INTEGER)
	{
		UVec4 maxValues = getFormatMaxUintValue(tcuFormat);

		clearValue.color.uint32[0] = (deUint32)((float)maxValues[0] * r);
		clearValue.color.uint32[1] = (deUint32)((float)maxValues[1] * g);
		clearValue.color.uint32[2] = (deUint32)((float)maxValues[2] * b);
		clearValue.color.uint32[3] = (deUint32)((float)maxValues[3] * a);
	}
	else if (getTextureChannelClass(tcuFormat.type) == TEXTURECHANNELCLASS_SIGNED_INTEGER)
	{
		IVec4 maxValues = getFormatMaxIntValue(tcuFormat);

		clearValue.color.int32[0] = (deUint32)((float)maxValues[0] * r);
		clearValue.color.int32[1] = (deUint32)((float)maxValues[1] * g);
		clearValue.color.int32[2] = (deUint32)((float)maxValues[2] * b);
		clearValue.color.int32[3] = (deUint32)((float)maxValues[3] * a);
	}
	else
		DE_FATAL("Unknown channel class");

	return clearValue;
}